

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O3

double __thiscall tinyxml2::XMLElement::DoubleAttribute(XMLElement *this,char *name)

{
  XMLAttribute *this_00;
  double d;
  double local_10;
  
  local_10 = 0.0;
  this_00 = FindAttribute(this,name);
  if (this_00 == (XMLAttribute *)0x0) {
    local_10 = 0.0;
  }
  else {
    XMLAttribute::QueryDoubleValue(this_00,&local_10);
  }
  return local_10;
}

Assistant:

double 	 DoubleAttribute( const char* name ) const	{
        double d=0;
        QueryDoubleAttribute( name, &d );
        return d;
    }